

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Joint::keyframe(Joint *this,double t)

{
  double dVar1;
  bool bVar2;
  reference ppJVar3;
  Joint *j;
  iterator __end2;
  iterator __begin2;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *__range2;
  Vector3D local_48;
  Vector3D local_30;
  double local_18;
  double t_local;
  Joint *this_local;
  
  local_18 = t;
  t_local = (double)this;
  Vector3D::Vector3D(&local_30,&(this->super_SceneObject).position);
  Spline<CMU462::Vector3D>::setValue(&(this->super_SceneObject).positions,t,&local_30);
  dVar1 = local_18;
  Vector3D::Vector3D(&local_48,&(this->super_SceneObject).rotation);
  Spline<CMU462::Vector3D>::setValue(&(this->super_SceneObject).rotations,dVar1,&local_48);
  dVar1 = local_18;
  Vector3D::Vector3D((Vector3D *)&__range2,&(this->super_SceneObject).scale);
  Spline<CMU462::Vector3D>::setValue(&(this->super_SceneObject).scales,dVar1,(Vector3D *)&__range2);
  __end2 = std::
           vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
           begin(&this->kids);
  j = (Joint *)std::
               vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>
               ::end(&this->kids);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
                                *)&j);
    if (!bVar2) break;
    ppJVar3 = __gnu_cxx::
              __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
              ::operator*(&__end2);
    keyframe(*ppJVar3,local_18);
    __gnu_cxx::
    __normal_iterator<CMU462::DynamicScene::Joint_**,_std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void Joint::keyframe(double t) {
     positions.setValue(t, position);
     rotations.setValue(t, rotation);
     scales.setValue(t, scale);
     for (Joint *j : kids) j->keyframe(t);
   }